

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O2

FT_Error sdf_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  byte bVar1;
  SDF_Edge_Type SVar2;
  FT_Outline *outline;
  FT_Memory pFVar3;
  FT_Bitmap *bitmap;
  SDF_Contour_ *pSVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  FT_Pointer pvVar9;
  byte bVar10;
  byte bVar11;
  char cVar12;
  FT_Orientation FVar13;
  FT_Error FVar14;
  int iVar15;
  SDF_Shape *shape;
  SDF_Contour *pSVar16;
  FT_Pointer P;
  FT_Pointer pvVar17;
  undefined4 uVar18;
  undefined8 *puVar19;
  long lVar20;
  long *plVar21;
  FT_Long size;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  FT_Pos FVar25;
  SDF_Edge *pSVar26;
  long lVar27;
  byte bVar28;
  ulong uVar29;
  long lVar30;
  byte bVar31;
  SDF_Contour **ppSVar32;
  SDF_Contour_ **ppSVar33;
  bool bVar34;
  SDF_Params internal_params;
  SDF_Params internal_params_00;
  FT_Error local_bc;
  uchar *local_b8;
  FT_Pointer local_b0;
  FT_Memory local_a8;
  FT_UInt local_9c;
  ulong local_98;
  SDF_Contour **local_90;
  ulong local_88;
  SDF_Contour *local_80;
  uint local_74;
  SDF_Contour *temp;
  SDF_Contour *local_68;
  SDF_Contour *local_60;
  ulong local_58;
  ulong local_50;
  FT_Bitmap *local_48;
  SDF_Shape *local_40;
  FT_Bitmap *local_38;
  
  if (params == (FT_Raster_Params *)0x0 || raster == (FT_Raster)0x0) {
LAB_00200525:
    FVar14 = 6;
  }
  else {
    outline = (FT_Outline *)params->source;
    if (outline == (FT_Outline *)0x0) {
      return 0x14;
    }
    if ((0 < outline->n_points) && (0 < outline->n_contours)) {
      if (outline->contours == (short *)0x0) {
        return 0x14;
      }
      if (outline->points == (FT_Vector *)0x0) {
        return 0x14;
      }
      if (*(int *)&params[1].target - 0x21U < 0xffffffe1) goto LAB_00200525;
      pFVar3 = *(FT_Memory *)raster;
      if (pFVar3 == (FT_Memory)0x0) {
        return 0x20;
      }
      FVar13 = FT_Outline_Get_Orientation(outline);
      local_b8 = (uchar *)CONCAT44(local_b8._4_4_,FVar13);
      local_98 = (ulong)*(byte *)((long)&params[1].target + 4);
      bVar28 = *(byte *)((long)&params[1].target + 5);
      temp = (SDF_Contour *)((ulong)temp._4_4_ << 0x20);
      shape = (SDF_Shape *)ft_mem_qalloc(pFVar3,0x10,(FT_Error *)&temp);
      if ((int)temp != 0) {
        return (int)temp;
      }
      shape->contours = (SDF_Contour *)0x0;
      shape->memory = pFVar3;
      FVar14 = FT_Outline_Decompose(outline,&sdf_decompose_funcs,shape);
      if (FVar14 != 0) {
        return FVar14;
      }
      uVar29 = (ulong)bVar28 << 0x28 | (ulong)local_b8 & 0xffffffff;
      ppSVar32 = &shape->contours;
      bitmap = params->target;
      if (*(char *)((long)&params[1].target + 6) == '\0') {
        uVar29 = uVar29 | local_98 << 0x20;
        internal_params.overload_sign = 0;
        internal_params.orientation = (int)uVar29;
        internal_params.flip_sign = (char)(uVar29 >> 0x20);
        internal_params.flip_y = (char)(uVar29 >> 0x28);
        internal_params._6_2_ = (short)(uVar29 >> 0x30);
        iVar15 = sdf_generate_subdivision
                           (internal_params,shape,*(FT_UInt *)&params[1].target,bitmap);
      }
      else {
        local_bc = 0;
        if ((bitmap == (FT_Bitmap *)0x0) || (local_a8 = shape->memory, local_a8 == (FT_Memory)0x0))
        goto LAB_00200525;
        local_50 = (ulong)(int)bitmap->width;
        local_88 = (ulong)bitmap->rows;
        size = 0;
        lVar27 = 0;
        lVar30 = 0;
        for (pSVar16 = *ppSVar32; pSVar16 != (SDF_Contour *)0x0; pSVar16 = pSVar16->next) {
          lVar30 = lVar30 + 1;
          lVar27 = lVar27 + 4;
          size = size + 0x28;
        }
        local_9c = *(FT_UInt *)&params[1].target;
        local_90 = ppSVar32;
        temp = (SDF_Contour *)local_a8;
        local_48 = bitmap;
        local_40 = shape;
        local_b0 = ft_mem_alloc(local_a8,size,&local_bc);
        if (local_bc == 0) {
          local_58 = uVar29;
          P = ft_mem_alloc(local_a8,lVar27,&local_bc);
          if (local_bc == 0) {
            local_74 = (uint)local_b8 ^ 1;
            local_80 = (SDF_Contour *)0x0;
            ppSVar33 = local_90;
            for (lVar27 = 0; pvVar9 = local_b0, lVar30 != lVar27; lVar27 = lVar27 + 1) {
              pSVar16 = *ppSVar33;
              lVar20 = lVar27 * 0x28;
              local_38 = (FT_Bitmap *)(lVar20 + (long)local_b0);
              FT_Bitmap_Init(local_38);
              uVar5._0_4_ = local_48->rows;
              uVar5._4_4_ = local_48->width;
              *(undefined8 *)((long)pvVar9 + lVar20) = uVar5;
              iVar15 = local_48->pitch;
              *(int *)((long)pvVar9 + lVar20 + 8) = iVar15;
              *(unsigned_short *)((long)pvVar9 + lVar20 + 0x18) = local_48->num_grays;
              *(uchar *)((long)pvVar9 + lVar20 + 0x1a) = local_48->pixel_mode;
              pvVar17 = ft_mem_alloc(local_a8,(ulong)(uint)((undefined4)uVar5 * iVar15),&local_bc);
              *(FT_Pointer *)((long)pvVar9 + lVar20 + 0x10) = pvVar17;
              if (local_bc != 0) goto LAB_002006a4;
              iVar15 = 0;
              if (pSVar16 != (SDF_Contour *)0x0) {
                pSVar26 = pSVar16->edges;
                iVar15 = 0;
                if (pSVar26 != (SDF_Edge *)0x0) {
                  iVar15 = 0;
                  for (; local_60 = pSVar16, pSVar26 != (SDF_Edge *)0x0; pSVar26 = pSVar26->next) {
                    SVar2 = pSVar26->edge_type;
                    lVar20 = 0x18;
                    if (SVar2 == SDF_EDGE_CUBIC) {
                      lVar6 = (pSVar26->control_a).x;
                      lVar7 = (pSVar26->control_a).y;
                      lVar8 = (pSVar26->control_b).x;
                      lVar23 = (pSVar26->end_pos).x - lVar8;
                      FVar25 = (pSVar26->control_b).y;
                      iVar15 = (int)(((lVar7 + FVar25) * (lVar8 - lVar6)) / 0x40) +
                               iVar15 + (int)((((pSVar26->start_pos).y + lVar7) *
                                              (lVar6 - (pSVar26->start_pos).x)) / 0x40);
                    }
                    else if (SVar2 == SDF_EDGE_CONIC) {
                      lVar6 = (pSVar26->control_a).x;
                      lVar23 = (pSVar26->end_pos).x - lVar6;
                      FVar25 = (pSVar26->control_a).y;
                      iVar15 = iVar15 + (int)((((pSVar26->start_pos).y + FVar25) *
                                              (lVar6 - (pSVar26->start_pos).x)) / 0x40);
                    }
                    else {
                      if (SVar2 != SDF_EDGE_LINE) {
                        iVar15 = 0;
                        goto LAB_00200915;
                      }
                      FVar25 = (pSVar26->end_pos).y;
                      lVar23 = (pSVar26->end_pos).x - (pSVar26->start_pos).x;
                      lVar20 = 8;
                    }
                    iVar15 = (int)(((FVar25 + *(long *)((long)&(pSVar26->start_pos).x + lVar20)) *
                                   lVar23) / 0x40) + iVar15;
                  }
                  iVar15 = (iVar15 < 1) + 1;
                }
              }
LAB_00200915:
              *(int *)((long)P + lVar27 * 4) = iVar15;
              pSVar4 = pSVar16->next;
              pSVar16->next = (SDF_Contour_ *)0x0;
              internal_params_00.overload_sign._0_1_ =
                   iVar15 == 1 && local_74 == 0 || iVar15 == 2 && (uint)local_b8 == 0;
              internal_params_00.orientation = (undefined4)local_58;
              internal_params_00.flip_sign = local_58._4_1_;
              internal_params_00.flip_y = local_58._5_1_;
              internal_params_00._6_2_ = local_58._6_2_;
              internal_params_00.overload_sign._1_3_ = 0;
              local_68 = pSVar16;
              local_bc = sdf_generate_subdivision
                                   (internal_params_00,(SDF_Shape *)&temp,local_9c,local_38);
              if (local_bc != 0) goto LAB_002006a9;
              ppSVar33 = &pSVar16->next;
              *ppSVar33 = pSVar4;
              local_68->next = local_80;
              if ((uint)local_b8 == 1) {
                iVar15 = *(int *)((long)P + lVar27 * 4);
                uVar18 = 2;
                if (iVar15 != 1) {
                  if (iVar15 != 2) goto LAB_00200997;
                  uVar18 = 1;
                }
                *(undefined4 *)((long)P + lVar27 * 4) = uVar18;
              }
LAB_00200997:
              local_80 = local_68;
            }
            *local_90 = local_80;
            local_b8 = local_48->buffer;
            uVar29 = 0;
            if (0 < (int)local_50) {
              uVar29 = local_50 & 0xffffffff;
            }
            iVar15 = (int)local_88;
            local_88 = local_88 & 0xffffffff;
            if (iVar15 < 1) {
              local_88 = 0;
            }
            cVar12 = (char)local_98;
            uVar24 = 0;
            while (uVar22 = uVar24, uVar22 != local_88) {
              for (uVar24 = 0; uVar24 != uVar29; uVar24 = uVar24 + 1) {
                lVar27 = uVar24 + uVar22 * local_50;
                bVar28 = 0xff;
                bVar31 = 0;
                plVar21 = (long *)((long)local_b0 + 0x10);
                for (lVar20 = 0; lVar30 != lVar20; lVar20 = lVar20 + 1) {
                  bVar1 = *(byte *)(*plVar21 + lVar27);
                  bVar10 = bVar31;
                  bVar11 = bVar28;
                  if (*(int *)((long)P + lVar20 * 4) == 1) {
                    bVar10 = bVar1;
                    if (bVar1 < bVar31) {
                      bVar10 = bVar31;
                    }
                  }
                  else {
                    bVar11 = bVar1;
                    if (bVar28 < bVar1) {
                      bVar11 = bVar28;
                    }
                  }
                  bVar28 = bVar11;
                  bVar31 = bVar10;
                  plVar21 = plVar21 + 5;
                }
                if (bVar31 < bVar28) {
                  bVar28 = bVar31;
                }
                local_b8[lVar27] = bVar28 ^ -(cVar12 != '\0');
              }
              local_98 = uVar22;
              uVar24 = uVar22 + 1;
            }
          }
LAB_002006a4:
          if (P != (FT_Pointer)0x0) {
LAB_002006a9:
            ft_mem_free(local_a8,P);
          }
        }
        ppSVar32 = local_90;
        pFVar3 = local_a8;
        shape = local_40;
        iVar15 = local_bc;
        if (local_b0 != (FT_Pointer)0x0) {
          if ((int)lVar30 == 0) {
            return 0x61;
          }
          puVar19 = (undefined8 *)((long)local_b0 + 0x10);
          while (bVar34 = lVar30 != 0, lVar30 = lVar30 + -1, bVar34) {
            ft_mem_free(pFVar3,(void *)*puVar19);
            *puVar19 = 0;
            puVar19 = puVar19 + 5;
          }
          ft_mem_free(pFVar3,local_b0);
          shape = local_40;
          iVar15 = local_bc;
        }
      }
      if (iVar15 != 0) {
        return iVar15;
      }
      pFVar3 = shape->memory;
      if (pFVar3 != (FT_Memory)0x0) {
        pSVar16 = *ppSVar32;
        while (pSVar16 != (SDF_Contour *)0x0) {
          pSVar4 = pSVar16->next;
          temp = pSVar16;
          sdf_contour_done(pFVar3,&temp);
          pSVar16 = pSVar4;
        }
        ft_mem_free(pFVar3,shape);
      }
    }
    FVar14 = 0;
  }
  return FVar14;
}

Assistant:

static FT_Error
  sdf_raster_render( FT_Raster                raster,
                     const FT_Raster_Params*  params )
  {
    FT_Error                  error      = FT_Err_Ok;
    SDF_TRaster*              sdf_raster = (SDF_TRaster*)raster;
    FT_Outline*               outline    = NULL;
    const SDF_Raster_Params*  sdf_params = (const SDF_Raster_Params*)params;

    FT_Memory   memory = NULL;
    SDF_Shape*  shape  = NULL;
    SDF_Params  internal_params;


    /* check for valid arguments */
    if ( !sdf_raster || !sdf_params )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    outline = (FT_Outline*)sdf_params->root.source;

    /* check whether outline is valid */
    if ( !outline )
    {
      error = FT_THROW( Invalid_Outline );
      goto Exit;
    }

    /* if the outline is empty, return */
    if ( outline->n_points <= 0 || outline->n_contours <= 0 )
      goto Exit;

    /* check whether the outline has valid fields */
    if ( !outline->contours || !outline->points )
    {
      error = FT_THROW( Invalid_Outline );
      goto Exit;
    }

    /* check whether spread is set properly */
    if ( sdf_params->spread > MAX_SPREAD ||
         sdf_params->spread < MIN_SPREAD )
    {
      FT_TRACE0(( "sdf_raster_render:"
                  " The `spread' field of `SDF_Raster_Params' is invalid,\n" ));
      FT_TRACE0(( "                  "
                  " the value of this field must be within [%d, %d].\n",
                  MIN_SPREAD, MAX_SPREAD ));
      FT_TRACE0(( "                  "
                  " Also, you must pass `SDF_Raster_Params' instead of\n" ));
      FT_TRACE0(( "                  "
                  " the default `FT_Raster_Params' while calling\n" ));
      FT_TRACE0(( "                  "
                  " this function and set the fields properly.\n" ));

      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    memory = sdf_raster->memory;
    if ( !memory )
    {
      FT_TRACE0(( "sdf_raster_render:"
                  " Raster not setup properly,\n" ));
      FT_TRACE0(( "                  "
                  " unable to find memory handle.\n" ));

      error = FT_THROW( Invalid_Handle );
      goto Exit;
    }

    /* set up the parameters */
    internal_params.orientation   = FT_Outline_Get_Orientation( outline );
    internal_params.flip_sign     = sdf_params->flip_sign;
    internal_params.flip_y        = sdf_params->flip_y;
    internal_params.overload_sign = 0;

    FT_CALL( sdf_shape_new( memory, &shape ) );

    FT_CALL( sdf_outline_decompose( outline, shape ) );

    if ( sdf_params->overlaps )
      FT_CALL( sdf_generate_with_overlaps( internal_params,
                                           shape, sdf_params->spread,
                                           sdf_params->root.target ) );
    else
      FT_CALL( sdf_generate_subdivision( internal_params,
                                         shape, sdf_params->spread,
                                         sdf_params->root.target ) );

    if ( shape )
      sdf_shape_done( &shape );

  Exit:
    return error;
  }